

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

void read_grammar(void)

{
  int iVar1;
  ushort **ppuVar2;
  
  initialize_grammar();
  advance_to_start();
LAB_0011608a:
  iVar1 = nextc();
  if (iVar1 == -1) goto LAB_00116146;
  ppuVar2 = __ctype_b_loc();
  if (((*ppuVar2)[iVar1] >> 10 & 1) != 0) goto switchD_001160de_caseD_22;
  switch(iVar1) {
  case 0x22:
  case 0x24:
  case 0x27:
    goto switchD_001160de_caseD_22;
  case 0x23:
  case 0x26:
switchD_001160de_caseD_23:
    syntax_error(input_file->lineno,line,cptr);
    goto LAB_0011608a;
  case 0x25:
    break;
  default:
    if (iVar1 != 0x2e) {
      if ((iVar1 != 0x3d) && (iVar1 != 0x5b)) {
        if (iVar1 == 0x7c) {
          end_rule();
          start_rule(plhs[(long)nrules + -1],0);
          cptr = cptr + 1;
          goto LAB_0011608a;
        }
        if (iVar1 != 0x7b) {
          if (iVar1 != 0x5f) goto switchD_001160de_caseD_23;
          goto switchD_001160de_caseD_22;
        }
      }
      copy_action();
      goto LAB_0011608a;
    }
switchD_001160de_caseD_22:
    add_symbol();
    goto LAB_0011608a;
  }
  iVar1 = mark_symbol();
  if (iVar1 != 0) {
LAB_00116146:
    end_rule();
    if (goal->args < 1) {
      return;
    }
    error(0,(char *)0x0,(char *)0x0,"start symbol %s requires arguments",goal->name);
    return;
  }
  goto LAB_0011608a;
}

Assistant:

void read_grammar()
{
    register int c;

    initialize_grammar();
    advance_to_start();

    for (;;) {
	c = nextc();
	if (c == EOF) break;
	if (isalpha(c) || c == '_' || c == '.' || c == '$' || c == '\'' ||
		c == '"')
	    add_symbol();
	else if (c == '{' || c == '=' || c == '[')
	    copy_action();
	else if (c == '|') {
	    end_rule();
	    start_rule(plhs[nrules-1], 0);
	    ++cptr; }
	else if (c == '%') {
	    if (mark_symbol()) break; }
	else
	    syntax_error(input_file->lineno, line, cptr); }
    end_rule();
    if (goal->args > 0)
	error(0, 0, 0, "start symbol %s requires arguments", goal->name);
}